

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall JSON::Node::Node(Node *this,string *type,string *rawValue,int start,int end)

{
  int end_local;
  int start_local;
  string *rawValue_local;
  string *type_local;
  Node *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)type);
  this->start = start;
  this->end = end;
  std::__cxx11::string::string((string *)&this->rawValue,(string *)rawValue);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::vector(&this->children);
  return;
}

Assistant:

Node(string type, string rawValue, int start, int end)
                : type(type), rawValue(rawValue), start(start), end(end) {
        }